

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_NightmareRespawn(AActor *mobj)

{
  AActor *thing;
  bool bVar1;
  uint uVar2;
  MetaClass *type;
  double dVar3;
  TVector2<double> local_b0;
  TVector3<double> local_a0;
  DVector3 local_88;
  DVector3 local_70;
  TVector2<double> local_58;
  TVector3<double> local_48;
  TFlags<ActorFlag2,_unsigned_int> local_30;
  TFlags<ActorFlag,_unsigned_int> local_2c;
  AActor *local_28;
  AActor *info;
  AActor *mo;
  double z;
  AActor *mobj_local;
  
  z = (double)mobj;
  local_28 = AActor::GetDefault(mobj);
  *(int *)((long)z + 0x264) = *(int *)((long)z + 0x264) + 1;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_2c,
             (int)local_28 +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
  if (uVar2 == 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_30,(int)local_28 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
    if (uVar2 == 0) {
      mo = (AActor *)0xc1e0000000000000;
    }
    else {
      mo = (AActor *)0x41dfffffff800000;
    }
  }
  else {
    mo = (AActor *)0x41dfffffffc00000;
  }
  type = AActor::GetClass((AActor *)z);
  TVector3<double>::TVector3
            (&local_48,*(double *)((long)z + 0x240),*(double *)((long)z + 0x248),(double)mo);
  info = AActor::StaticSpawn(type,&local_48,NO_REPLACE,true);
  if (((double)mo != -2147483648.0) || (NAN((double)mo))) {
    if (((double)mo == 2147483647.0) && (!NAN((double)mo))) {
      AActor::AddZ(info,-*(double *)((long)z + 0x250),true);
    }
  }
  else {
    AActor::AddZ(info,*(double *)((long)z + 0x250),true);
    dVar3 = AActor::Z(info);
    if (dVar3 < info->floorz) {
      AActor::SetZ(info,info->floorz,true);
    }
    dVar3 = AActor::Top(info);
    if (info->ceilingz <= dVar3 && dVar3 != info->ceilingz) {
      AActor::SetZ(info,info->ceilingz - info->Height,true);
    }
  }
  P_FindFloorCeiling(info,0xe);
  if (((double)mo == -2147483648.0) && (!NAN((double)mo))) {
    dVar3 = AActor::Z(info);
    if (dVar3 < info->floorz) {
      AActor::SetZ(info,info->floorz,true);
    }
    dVar3 = AActor::Top(info);
    if (info->ceilingz <= dVar3 && dVar3 != info->ceilingz) {
      AActor::SetZ(info,info->ceilingz - info->Height,true);
    }
  }
  thing = info;
  AActor::Pos(&local_70,info);
  TVector2<double>::TVector2(&local_58,&local_70);
  bVar1 = P_CheckPosition(thing,&local_58,true);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    mo = (AActor *)AActor::Z(info);
    TVector3<double>::operator=(&info->SpawnPoint,(TVector3<double> *)((long)z + 0x240));
    info->SpawnAngle = *(WORD *)((long)z + 600);
    info->SpawnFlags = *(uint *)((long)z + 0x2dc) & 0xffffffef;
    TAngle<double>::operator=(&(info->Angles).Yaw,(double)*(ushort *)((long)z + 600));
    (*(info->super_DThinker).super_DObject._vptr_DObject[0xb])();
    info->reactiontime = 0x12;
    AActor::CopyFriendliness(info,(AActor *)z,false,true);
    dVar3 = z;
    info->Translation = *(DWORD *)((long)z + 0x3c0);
    info->skillrespawncount = *(int *)((long)z + 0x264);
    (info->Prev).Z = (double)mo;
    AActor::Pos(&local_88,(AActor *)z);
    P_SpawnTeleportFog((AActor *)dVar3,&local_88,true,true);
    dVar3 = z;
    TVector2<double>::TVector2(&local_b0,(TVector3<double> *)((long)z + 0x240));
    TVector3<double>::TVector3(&local_a0,&local_b0,(double)mo);
    P_SpawnTeleportFog((AActor *)dVar3,&local_a0,false,true);
    (**(code **)(*(long *)z + 0x20))();
  }
  else {
    AActor::ClearCounters(info);
    (*(info->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  return;
}

Assistant:

void P_NightmareRespawn (AActor *mobj)
{
	double z;
	AActor *mo;
	AActor *info = mobj->GetDefault();

	mobj->skillrespawncount++;

	// spawn the new monster (assume the spawn will be good)
	if (info->flags & MF_SPAWNCEILING)
		z = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		z = FLOATRANDZ;
	else
		z = ONFLOORZ;

	// spawn it
	mo = AActor::StaticSpawn(mobj->GetClass(), DVector3(mobj->SpawnPoint.X, mobj->SpawnPoint.Y, z), NO_REPLACE, true);

	if (z == ONFLOORZ)
	{
		mo->AddZ(mobj->SpawnPoint.Z);
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz- mo->Height);
		}
	}
	else if (z == ONCEILINGZ)
	{
		mo->AddZ(-mobj->SpawnPoint.Z);
	}

	// If there are 3D floors, we need to find floor/ceiling again.
	P_FindFloorCeiling(mo, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);

	if (z == ONFLOORZ)
	{
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{ // Do the same for the ceiling.
			mo->SetZ(mo->ceilingz - mo->Height);
		}
	}

	// something is occupying its position?
	if (!P_CheckPosition(mo, mo->Pos(), true))
	{
		//[GrafZahl] MF_COUNTKILL still needs to be checked here.
		mo->ClearCounters();
		mo->Destroy ();
		return;		// no respawn
	}

	z = mo->Z();

	// inherit attributes from deceased one
	mo->SpawnPoint = mobj->SpawnPoint;
	mo->SpawnAngle = mobj->SpawnAngle;
	mo->SpawnFlags = mobj->SpawnFlags & ~MTF_DORMANT;	// It wasn't dormant when it died, so it's not dormant now, either.
	mo->Angles.Yaw = (double)mobj->SpawnAngle;

	mo->HandleSpawnFlags ();
	mo->reactiontime = 18;
	mo->CopyFriendliness (mobj, false);
	mo->Translation = mobj->Translation;

	mo->skillrespawncount = mobj->skillrespawncount;

	mo->Prev.Z = z;		// Do not interpolate Z position if we changed it since spawning.

	// spawn a teleport fog at old spot because of removal of the body?
	P_SpawnTeleportFog(mobj, mobj->Pos(), true, true);

	// spawn a teleport fog at the new spot
	P_SpawnTeleportFog(mobj, DVector3(mobj->SpawnPoint, z), false, true);

	// remove the old monster
	mobj->Destroy ();
}